

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O2

void __thiscall CBroadcast::RenderServerBroadcast(CBroadcast *this)

{
  CTextCursor *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  CGameClient *pCVar4;
  IGraphics *pIVar5;
  ITextRender *pIVar6;
  _func_int **pp_Var7;
  int i;
  long lVar8;
  long in_FS_OFFSET;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  CTextBoundingBox CVar13;
  vec4 local_40;
  CUIRect BroadcastView;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (this->super_CComponent).m_pClient;
  if ((((pCVar4->m_pConfig->m_ClShowServerBroadcast != 0) && (this->m_MuteServerBroadcast == false))
      && (0 < (this->m_ServerBroadcastCursor).m_Glyphs.num_elements)) &&
     (pCVar4->m_pChat->m_Mode == 0)) {
    fVar9 = pCVar4->m_pClient->m_LocalTime - this->m_ServerBroadcastReceivedTime;
    if (fVar9 <= 10.0) {
      this_00 = &this->m_ServerBroadcastCursor;
      pIVar5 = pCVar4->m_pGraphics;
      uVar1 = pIVar5->m_ScreenWidth;
      uVar2 = pIVar5->m_ScreenHeight;
      fVar11 = ((float)(int)uVar1 / (float)(int)uVar2) * 300.0;
      (*(pIVar5->super_IInterface)._vptr_IInterface[5])(0,0,fVar11);
      fVar9 = fVar9 + -9.0;
      fVar10 = 0.0;
      if (0.0 <= fVar9) {
        fVar10 = fVar9;
      }
      fVar10 = 1.0 - fVar10;
      CVar13 = CTextCursor::BoundingBox(this_00);
      fVar12 = CVar13.h;
      BroadcastView.w = fVar11 * 0.5;
      fVar9 = fVar12;
      if (fVar12 <= 10.0) {
        fVar9 = 10.0;
      }
      BroadcastView.h = fVar9 + 2.0;
      BroadcastView.x = BroadcastView.w * 0.5;
      BroadcastView.y = 300.0 - BroadcastView.h;
      local_40.field_3.w = fVar10 * 0.25;
      local_40.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
      local_40.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
      local_40.field_2.z = 0.0;
      CUIRect::Draw(&BroadcastView,&local_40,5.0,3);
      (this->m_ServerBroadcastCursor).m_CursorPos.field_0.x =
           BroadcastView.w * 0.5 + BroadcastView.x;
      (this->m_ServerBroadcastCursor).m_CursorPos.field_1.y =
           (BroadcastView.h * 0.5 + BroadcastView.y) - fVar12 * 0.5;
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x11])
                (0x400000003f800000,fVar10,pIVar6,this_00,0,
                 (ulong)(uint)this->m_aServerBroadcastSegments[0].m_GlyphPos);
      for (lVar8 = 0; lVar8 < this->m_NumSegments; lVar8 = lVar8 + 1) {
        pIVar6 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        pp_Var7 = (pIVar6->super_IInterface)._vptr_IInterface;
        if (this->m_aServerBroadcastSegments[lVar8].m_IsHighContrast == true) {
          (*pp_Var7[0x10])((ulong)(uint)fVar10,pIVar6,this_00);
        }
        else {
          (*pp_Var7[0x11])(0x400000003f800000,fVar10,pIVar6,this_00,
                           (ulong)(uint)this->m_aServerBroadcastSegments[lVar8].m_GlyphPos,
                           (ulong)(uint)this->m_aServerBroadcastSegments[lVar8 + 1].m_GlyphPos);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBroadcast::RenderServerBroadcast()
{
	if(!Config()->m_ClShowServerBroadcast || m_MuteServerBroadcast || !m_ServerBroadcastCursor.Rendered())
		return;
	if(m_pClient->m_pChat->IsActive())
		return;

	const float DisplayDuration = 10.0f;
	const float DisplayStartFade = 9.0f;
	const float DeltaTime = Client()->LocalTime() - m_ServerBroadcastReceivedTime;

	if(DeltaTime > DisplayDuration)
		return;

	const float Height = 300;
	const float Width = Height*Graphics()->ScreenAspect();
	Graphics()->MapScreen(0, 0, Width, Height);

	const float Fade = 1.0f - maximum(0.0f, (DeltaTime - DisplayStartFade) / (DisplayDuration - DisplayStartFade));
	const float TextHeight = m_ServerBroadcastCursor.BoundingBox().h;
	const float Rounding = 5.0f;

	CUIRect BroadcastView;
	BroadcastView.w = Width * 0.5f;
	BroadcastView.h = maximum(TextHeight, 2*Rounding) + 2.0f;
	BroadcastView.x = BroadcastView.w * 0.5f;
	BroadcastView.y = Height - BroadcastView.h;

	BroadcastView.Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f * Fade), Rounding, CUIRect::CORNER_T);

	// draw lines
	const vec2 ShadowOffset(1.0f, 2.0f);
	m_ServerBroadcastCursor.MoveTo(BroadcastView.x + BroadcastView.w/2, BroadcastView.y + BroadcastView.h/2 - TextHeight/2);

	TextRender()->DrawTextShadowed(&m_ServerBroadcastCursor, ShadowOffset, Fade, 0, m_aServerBroadcastSegments[0].m_GlyphPos);
	for(int i = 0; i < m_NumSegments; ++i)
	{
		CBroadcastSegment *pSegment = &m_aServerBroadcastSegments[i];
		if(m_aServerBroadcastSegments[i].m_IsHighContrast)
			TextRender()->DrawTextOutlined(&m_ServerBroadcastCursor, Fade, pSegment->m_GlyphPos, (pSegment+1)->m_GlyphPos);
		else
			TextRender()->DrawTextShadowed(&m_ServerBroadcastCursor, ShadowOffset, Fade, pSegment->m_GlyphPos, (pSegment+1)->m_GlyphPos);
	}
}